

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O1

uint32_t farmhashcc::Hash32(char *s,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  uVar5 = (uint)len;
  if (0x18 < len) {
    uVar3 = (*(int *)(s + (len - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar5;
    uVar3 = (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64 ^
            (*(int *)(s + (len - 0x10)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x10)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar4 = (*(int *)(s + (len - 8)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            uVar5 * -0x3361d2af;
    uVar3 = (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
    uVar4 = (uVar4 >> 0x13 | uVar4 << 0xd) * 5 + 0xe6546b64 ^
            (*(int *)(s + (len - 0xc)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0xc)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar4 = (uVar4 >> 0x13 | uVar4 << 0xd) * 5 + 0xe6546b64;
    uVar5 = (*(int *)(s + (len - 0x14)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x14)) * -0x3361d2af) >> 0x11) * 0x1b873593 +
            uVar5 * -0x3361d2af;
    uVar5 = (uVar5 >> 0x13 | uVar5 * 0x2000) * 5 + 0xe6546b64;
    uVar7 = (len - 1) / 0x14;
    do {
      uVar8 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593;
      uVar4 = (*(int *)((long)s + 8) * 0x16a88000 |
              (uint)(*(int *)((long)s + 8) * -0x3361d2af) >> 0x11) * 0x1b873593 + uVar4;
      uVar3 = uVar3 ^ uVar8;
      uVar9 = uVar5 + *(int *)((long)s + 4);
      uVar3 = (*(int *)((long)s + 0xc) * 0x16a88000 |
              (uint)(*(int *)((long)s + 0xc) * -0x3361d2af) >> 0x11) * 0x1b873593 +
              *(int *)((long)s + 4) ^ (uVar3 >> 0x12 | uVar3 << 0xe) * 5 + 0xe6546b64;
      uVar5 = (uVar4 >> 0x12 | uVar4 * 0x4000) * 5 + 0xe6546b64 ^ *(uint *)((long)s + 0x10);
      uVar1 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8;
      uVar5 = (uVar1 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) * 5;
      uVar3 = ((uVar3 >> 0x13 | uVar3 << 0xd) + *(uint *)((long)s + 0x10)) * 5 + 0xe6546b64;
      uVar2 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8;
      uVar4 = uVar2 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
      uVar3 = (uVar9 >> 0x13 | uVar9 * 0x2000) * -0x3361d2af + uVar8;
      s = (char *)((long)s + 0x14);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar3 = ((uVar4 >> 0xb) * 0x16a88000 | (uVar4 >> 0xb | uVar2 << 0x15) * -0x3361d2af >> 0x11) *
            -0x3361d2af + uVar3;
    uVar3 = (uVar3 >> 0x13 | uVar3 * 0x2000) * 5 + 0xe6546b64;
    iVar10 = (uVar3 >> 0x11 | uVar3 * 0x8000) +
             ((uVar5 >> 0xb) * 0x16a88000 | (uVar1 * 0xa00000 | uVar5 >> 0xb) * -0x3361d2af >> 0x11)
    ;
    uVar5 = (iVar10 * -0x3a55e000 | (uint)(iVar10 * -0x3361d2af) >> 0x13) * 5 + 0xe6546b64;
    return (uVar5 >> 0x11 | uVar5 * 0x8000) * -0x3361d2af;
  }
  if (len < 0xd) {
    if (len < 5) {
      if (len == 0) {
        uVar3 = 0;
        uVar4 = 9;
      }
      else {
        uVar4 = 9;
        uVar3 = 0;
        sVar6 = 0;
        do {
          uVar3 = uVar3 * -0x3361d2af + (int)s[sVar6];
          uVar4 = uVar4 ^ uVar3;
          sVar6 = sVar6 + 1;
        } while (len != sVar6);
      }
      uVar4 = (uVar5 * 0x16a88000 | uVar5 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar4;
      uVar5 = uVar4 >> 0x13 | uVar4 << 0xd;
    }
    else {
      iVar10 = *(int *)(s + (len - 4)) + uVar5 * 5;
      uVar3 = *(int *)(s + (ulong)(uVar5 >> 3 & 1) * 4) + 9;
      uVar5 = ((*(int *)s + uVar5) * 0x16a88000 | (*(int *)s + uVar5) * -0x3361d2af >> 0x11) *
              0x1b873593 ^ uVar5 * 5;
      uVar5 = (iVar10 * 0x16a88000 | (uint)(iVar10 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64;
      uVar5 = uVar5 >> 0x13 | uVar5 << 0xd;
    }
    uVar5 = (uVar3 * 0x16a88000 | uVar3 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar5 * 5 + 0xe6546b64
    ;
    uVar5 = uVar5 >> 0x13 | uVar5 << 0xd;
  }
  else {
    uVar5 = (*(int *)(s + ((len >> 1) - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + ((len >> 1) - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar5;
    uVar5 = (*(int *)(s + 4) * 0x16a88000 | (uint)(*(int *)(s + 4) * -0x3361d2af) >> 0x11) *
            0x1b873593 ^ (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64;
    uVar5 = (*(int *)(s + (len - 8)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64;
    uVar5 = (*(int *)(s + (len >> 1)) * 0x16a88000 |
            (uint)(*(int *)(s + (len >> 1)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64;
    uVar5 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64;
    uVar5 = (*(int *)(s + (len - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64;
    uVar5 = uVar5 >> 0x13 | uVar5 << 0xd;
  }
  uVar5 = uVar5 * 5 + 0xe6546b64;
  uVar5 = (uVar5 >> 0x10 ^ uVar5) * -0x7a143595;
  uVar5 = (uVar5 >> 0xd ^ uVar5) * -0x3d4d51cb;
  return uVar5 >> 0x10 ^ uVar5;
}

Assistant:

uint32_t Hash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len)) :
        Hash32Len13to24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = Rotate(Fetch(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = Rotate(Fetch(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = Rotate(Fetch(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = Rotate(Fetch(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = Rotate(Fetch(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a0 = Rotate(Fetch(s) * c1, 17) * c2;
    uint32_t a1 = Fetch(s + 4);
    uint32_t a2 = Rotate(Fetch(s + 8) * c1, 17) * c2;
    uint32_t a3 = Rotate(Fetch(s + 12) * c1, 17) * c2;
    uint32_t a4 = Fetch(s + 16);
    h ^= a0;
    h = Rotate(h, 18);
    h = h * 5 + 0xe6546b64;
    f += a1;
    f = Rotate(f, 19);
    f = f * c1;
    g += a2;
    g = Rotate(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= a3 + a1;
    h = Rotate(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= a4;
    g = Bswap(g) * 5;
    h += a4 * 5;
    h = Bswap(h);
    f += a0;
    PERMUTE3(f, h, g);
    s += 20;
  } while (--iters != 0);
  g = Rotate(g, 11) * c1;
  g = Rotate(g, 17) * c1;
  f = Rotate(f, 11) * c1;
  f = Rotate(f, 17) * c1;
  h = Rotate(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  h = Rotate(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  return h;
}